

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

bool __thiscall
HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,btVector3 *svertices,uint stride,uint *vcount,
          btVector3 *vertices,btScalar normalepsilon,btVector3 *scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  btVector3 *dest;
  btVector3 *pbVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  btScalar *pbVar11;
  float *_Val;
  uint i;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  btScalar bmin_1 [3];
  btScalar bmax_1 [3];
  btScalar bmax [3];
  btScalar bmin [3];
  float local_e8 [4];
  float local_d8 [4];
  float local_c8 [4];
  ulong local_b8;
  float local_b0;
  uint *local_a8;
  btAlignedObjectArray<int> *local_a0;
  btScalar local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  btScalar local_58;
  btScalar bStack_54;
  btScalar bStack_50;
  btScalar bStack_4c;
  undefined1 local_48 [24];
  
  if (svcount == 0) goto LAB_0012514e;
  local_b8 = local_b8 & 0xffffffff00000000;
  _Val = (float *)0x0;
  local_a8 = vcount;
  local_98 = normalepsilon;
  btAlignedObjectArray<int>::resize(&this->m_vertexIndexMapping,0,(int *)&local_b8);
  *local_a8 = 0;
  scale->m_floats[0] = 1.0;
  scale->m_floats[1] = 1.0;
  scale->m_floats[2] = 1.0;
  local_b8 = 0x7f7fffff7f7fffff;
  local_b0 = 3.4028235e+38;
  local_c8[0] = -3.4028235e+38;
  local_c8[1] = -3.4028235e+38;
  local_c8[2] = -3.4028235e+38;
  pbVar6 = svertices;
  for (uVar12 = 0; uVar12 != svcount; uVar12 = uVar12 + 1) {
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      fVar17 = pbVar6->m_floats[lVar9];
      if (fVar17 < *(float *)((long)&local_b8 + lVar9 * 4)) {
        *(float *)((long)&local_b8 + lVar9 * 4) = fVar17;
      }
      if (local_c8[lVar9] <= fVar17 && fVar17 != local_c8[lVar9]) {
        local_c8[lVar9] = fVar17;
      }
    }
    pbVar6 = (btVector3 *)((long)pbVar6->m_floats + (ulong)stride);
  }
  local_c8[3] = local_c8[2] - local_b0;
  local_68 = local_c8[3] * 0.5 + local_b0;
  fVar17 = (float)local_c8._0_8_ - (float)local_b8;
  local_78 = (float)(local_b8 >> 0x20);
  fVar18 = SUB84(local_c8._0_8_,4) - local_78;
  local_88 = fVar17 * 0.5 + (float)local_b8;
  local_78 = fVar18 * 0.5 + local_78;
  uVar12 = -(uint)(fVar17 < 1e-06);
  uVar14 = -(uint)(fVar18 < 1e-06);
  if (svcount < 3) {
LAB_00124f64:
    fVar16 = fVar17;
    if (3.4028235e+38 <= fVar17) {
      fVar16 = 3.4028235e+38;
    }
    fVar20 = (float)(~-(uint)(1e-06 < fVar17) & 0x7f7fffff | (uint)fVar16 & -(uint)(1e-06 < fVar17))
    ;
    fVar16 = fVar18;
    if (fVar20 <= fVar18) {
      fVar16 = fVar20;
    }
    fVar20 = (float)((uint)fVar16 & -(uint)(1e-06 < fVar18) |
                    ~-(uint)(1e-06 < fVar18) & (uint)fVar20);
    fVar16 = local_c8[3];
    if (fVar20 <= local_c8[3] || local_c8[3] <= 1e-06) {
      fVar16 = fVar20;
    }
    if ((fVar16 != 3.4028235e+38) || (NAN(fVar16))) {
      fVar16 = fVar16 * 0.05;
      uVar7 = CONCAT44(~uVar14 & (uint)fVar18,~uVar12 & (uint)fVar17) |
              CONCAT44((uint)fVar16 & uVar14,(uint)fVar16 & uVar12);
      if (1e-06 <= local_c8[3]) {
        fVar16 = local_c8[3];
      }
    }
    else {
      uVar7 = 0x3c23d70a3c23d70a;
      fVar16 = 0.01;
    }
    fVar18 = local_88 - (float)uVar7;
    fVar17 = (float)(uVar7 >> 0x20);
    fVar20 = local_78 - fVar17;
    fVar19 = local_68 - fVar16;
    local_68 = local_68 + fVar16;
    *(ulong *)vertices->m_floats = CONCAT44(fVar20,fVar18);
    vertices->m_floats[2] = fVar19;
    vertices[1].m_floats[1] = fVar20;
    vertices[1].m_floats[2] = fVar19;
    local_88 = local_88 + (float)uVar7;
    local_78 = local_78 + fVar17;
    vertices[1].m_floats[0] = local_88;
    *(ulong *)vertices[2].m_floats = CONCAT44(local_78,local_88);
    vertices[2].m_floats[2] = fVar19;
    vertices[3].m_floats[0] = fVar18;
    vertices[3].m_floats[1] = local_78;
    vertices[3].m_floats[2] = fVar19;
    *(ulong *)vertices[4].m_floats = CONCAT44(fVar20,fVar18);
    vertices[4].m_floats[2] = local_68;
    vertices[5].m_floats[0] = local_88;
    vertices[5].m_floats[1] = fVar20;
    vertices[5].m_floats[2] = local_68;
    *(ulong *)vertices[6].m_floats = CONCAT44(local_78,local_88);
    vertices[6].m_floats[2] = local_68;
    vertices[7].m_floats[0] = fVar18;
    vertices[7].m_floats[1] = local_78;
    vertices[7].m_floats[2] = local_68;
  }
  else {
    auVar3._4_4_ = uVar12;
    auVar3._0_4_ = uVar12;
    auVar3._8_4_ = uVar14;
    auVar3._12_4_ = uVar14;
    uVar5 = movmskpd((int)pbVar6,auVar3);
    if ((((uVar5 & 1) != 0) || ((byte)((byte)uVar5 >> 1) != 0)) || (local_c8[3] < 1e-06))
    goto LAB_00124f64;
    *(ulong *)scale->m_floats = CONCAT44(fVar18,fVar17);
    scale->m_floats[2] = local_c8[3];
    auVar2._4_4_ = fVar18;
    auVar2._0_4_ = fVar17;
    auVar2._8_8_ = 0;
    local_48._0_16_ = divps(_DAT_001af400,auVar2);
    local_c8[3] = 1.0 / local_c8[3];
    local_88 = local_88 * local_48._0_4_;
    local_78 = local_78 * local_48._4_4_;
    local_68 = local_68 * local_c8[3];
    local_58 = local_98;
    bStack_54 = local_98;
    bStack_50 = local_98;
    bStack_4c = local_98;
    local_a0 = &this->m_vertexIndexMapping;
    fStack_84 = local_88;
    fStack_80 = local_88;
    fStack_7c = local_88;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_64 = local_68;
    fStack_60 = local_68;
    fStack_5c = local_68;
    for (uVar12 = 0; uVar12 != svcount; uVar12 = uVar12 + 1) {
      fVar17 = (float)*(undefined8 *)svertices->m_floats * (float)local_48._0_4_;
      fVar18 = (float)((ulong)*(undefined8 *)svertices->m_floats >> 0x20) * (float)local_48._4_4_;
      fVar16 = svertices->m_floats[2] * local_c8[3];
      uVar14 = *local_a8;
      uVar10 = (ulong)uVar14;
      pbVar11 = vertices->m_floats + 2;
      for (uVar7 = 0; uVar8 = uVar10, uVar10 != uVar7; uVar7 = uVar7 + 1) {
        fVar20 = (float)*(undefined8 *)((btVector3 *)(pbVar11 + -2))->m_floats;
        fVar19 = (float)((ulong)*(undefined8 *)((btVector3 *)(pbVar11 + -2))->m_floats >> 0x20);
        iVar13 = -(uint)(ABS(fVar20 - fVar17) < local_58);
        iVar15 = -(uint)(ABS(fVar19 - fVar18) < bStack_54);
        auVar4._4_4_ = iVar13;
        auVar4._0_4_ = iVar13;
        auVar4._8_4_ = iVar15;
        auVar4._12_4_ = iVar15;
        uVar5 = movmskpd((int)_Val,auVar4);
        _Val = (float *)(ulong)uVar5;
        if ((uVar5 == 3) && (ABS(*pbVar11 - fVar16) < local_98)) {
          fVar22 = *pbVar11 - fStack_64;
          fVar20 = fVar20 - fStack_84;
          fVar19 = fVar19 - fStack_74;
          if (fVar22 * fVar22 + fVar20 * fVar20 + fVar19 * fVar19 <
              (fVar16 - local_68) * (fVar16 - local_68) +
              (fVar17 - local_88) * (fVar17 - local_88) + (fVar18 - local_78) * (fVar18 - local_78))
          {
            *(ulong *)((btVector3 *)(pbVar11 + -2))->m_floats = CONCAT44(fVar18,fVar17);
            *pbVar11 = fVar16;
          }
          uVar8 = uVar7;
          if (uVar14 != (uint)uVar7) goto LAB_00124da6;
          break;
        }
        pbVar11 = pbVar11 + 4;
      }
      *(ulong *)vertices[uVar10].m_floats = CONCAT44(fVar18,fVar17);
      vertices[uVar10].m_floats[2] = fVar16;
      *local_a8 = uVar14 + 1;
LAB_00124da6:
      local_e8[0] = (float)(int)uVar8;
      _Val = local_e8;
      btAlignedObjectArray<int>::push_back(local_a0,(int *)_Val);
      svertices = (btVector3 *)((long)svertices->m_floats + (ulong)stride);
    }
    local_e8[0] = 3.4028235e+38;
    local_e8[1] = 3.4028235e+38;
    local_e8[2] = 3.4028235e+38;
    local_d8[0] = -3.4028235e+38;
    local_d8[1] = -3.4028235e+38;
    local_d8[2] = -3.4028235e+38;
    uVar12 = *local_a8;
    pbVar6 = vertices;
    for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        fVar17 = pbVar6->m_floats[lVar9];
        if (fVar17 < local_e8[lVar9]) {
          local_e8[lVar9] = fVar17;
        }
        if (local_d8[lVar9] <= fVar17 && fVar17 != local_d8[lVar9]) {
          local_d8[lVar9] = fVar17;
        }
      }
      pbVar6 = pbVar6 + 1;
    }
    local_d8[2] = local_d8[2] - local_e8[2];
    fVar17 = (float)local_d8._0_8_ - (float)local_e8._0_8_;
    fVar18 = SUB84(local_d8._0_8_,4) - SUB84(local_e8._0_8_,4);
    uVar14 = -(uint)(fVar17 < 1e-06);
    uVar5 = -(uint)(fVar18 < 1e-06);
    if (2 < uVar12) {
      auVar1._4_4_ = uVar14;
      auVar1._0_4_ = uVar14;
      auVar1._8_4_ = uVar5;
      auVar1._12_4_ = uVar5;
      uVar12 = movmskpd(uVar12,auVar1);
      if ((((uVar12 & 1) == 0) && ((byte)((byte)uVar12 >> 1) == 0)) && (1e-06 <= local_d8[2]))
      goto LAB_0012514e;
    }
    fVar16 = fVar17;
    if (3.4028235e+38 <= fVar17) {
      fVar16 = 3.4028235e+38;
    }
    fVar20 = (float)(~-(uint)(1e-06 <= fVar17) & 0x7f7fffff |
                    (uint)fVar16 & -(uint)(1e-06 <= fVar17));
    fVar16 = fVar18;
    if (fVar20 <= fVar18) {
      fVar16 = fVar20;
    }
    fVar20 = (float)((uint)fVar16 & -(uint)(1e-06 <= fVar18) |
                    ~-(uint)(1e-06 <= fVar18) & (uint)fVar20);
    fVar16 = local_d8[2];
    if (fVar20 <= local_d8[2] || local_d8[2] < 1e-06) {
      fVar16 = fVar20;
    }
    fVar20 = fVar17 * 0.5 + (float)local_e8._0_8_;
    fVar19 = fVar18 * 0.5 + SUB84(local_e8._0_8_,4);
    local_e8[2] = local_d8[2] * 0.5 + local_e8[2];
    if ((fVar16 != 3.4028235e+38) || (NAN(fVar16))) {
      fVar16 = fVar16 * 0.05;
      uVar7 = CONCAT44(~uVar5 & (uint)fVar18,~uVar14 & (uint)fVar17) |
              CONCAT44((uint)fVar16 & uVar5,(uint)fVar16 & uVar14);
      if (1e-06 <= local_d8[2]) {
        fVar16 = local_d8[2];
      }
    }
    else {
      uVar7 = 0x3c23d70a3c23d70a;
      fVar16 = 0.01;
    }
    fVar18 = fVar20 - (float)uVar7;
    fVar17 = (float)(uVar7 >> 0x20);
    fVar22 = fVar19 - fVar17;
    fVar21 = local_e8[2] - fVar16;
    local_e8[2] = local_e8[2] + fVar16;
    *(ulong *)vertices->m_floats = CONCAT44(fVar22,fVar18);
    vertices->m_floats[2] = fVar21;
    vertices[1].m_floats[1] = fVar22;
    vertices[1].m_floats[2] = fVar21;
    fVar20 = fVar20 + (float)uVar7;
    fVar19 = fVar19 + fVar17;
    vertices[1].m_floats[0] = fVar20;
    *(ulong *)vertices[2].m_floats = CONCAT44(fVar19,fVar20);
    vertices[2].m_floats[2] = fVar21;
    vertices[3].m_floats[0] = fVar18;
    vertices[3].m_floats[1] = fVar19;
    vertices[3].m_floats[2] = fVar21;
    *(ulong *)vertices[4].m_floats = CONCAT44(fVar22,fVar18);
    vertices[4].m_floats[2] = local_e8[2];
    vertices[5].m_floats[0] = fVar20;
    vertices[5].m_floats[1] = fVar22;
    vertices[5].m_floats[2] = local_e8[2];
    *(ulong *)vertices[6].m_floats = CONCAT44(fVar19,fVar20);
    vertices[6].m_floats[2] = local_e8[2];
    vertices[7].m_floats[0] = fVar18;
    vertices[7].m_floats[1] = fVar19;
    vertices[7].m_floats[2] = local_e8[2];
  }
  *local_a8 = 8;
LAB_0012514e:
  return svcount != 0;
}

Assistant:

bool  HullLibrary::CleanupVertices(unsigned int svcount,
				   const btVector3 *svertices,
				   unsigned int stride,
				   unsigned int &vcount,       // output number of vertices
				   btVector3 *vertices,                 // location to store the results.
				   btScalar  normalepsilon,
				   btVector3& scale)
{
	if ( svcount == 0 ) return false;

	m_vertexIndexMapping.resize(0);


#define EPSILON btScalar(0.000001) /* close enough to consider two btScalaring point numbers to be 'the same'. */

	vcount = 0;

	btScalar recip[3]={0.f,0.f,0.f};

	if ( scale )
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	btScalar bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
	btScalar bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

	const char *vtx = (const char *) svertices;

//	if ( 1 )
	{
		for (unsigned int i=0; i<svcount; i++)
		{
			const btScalar *p = (const btScalar *) vtx;

			vtx+=stride;

			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}
	}

	btScalar dx = bmax[0] - bmin[0];
	btScalar dy = bmax[1] - bmin[1];
	btScalar dz = bmax[2] - bmin[2];

	btVector3 center;

	center[0] = dx*btScalar(0.5) + bmin[0];
	center[1] = dy*btScalar(0.5) + bmin[1];
	center[2] = dz*btScalar(0.5) + bmin[2];

	if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3 )
	{

		btScalar len = FLT_MAX;

		if ( dx > EPSILON && dx < len ) len = dx;
		if ( dy > EPSILON && dy < len ) len = dy;
		if ( dz > EPSILON && dz < len ) len = dz;

		if ( len == FLT_MAX )
		{
			dx = dy = dz = btScalar(0.01); // one centimeter
		}
		else
		{
			if ( dx < EPSILON ) dx = len * btScalar(0.05); // 1/5th the shortest non-zero edge.
			if ( dy < EPSILON ) dy = len * btScalar(0.05);
			if ( dz < EPSILON ) dz = len * btScalar(0.05);
		}

		btScalar x1 = center[0] - dx;
		btScalar x2 = center[0] + dx;

		btScalar y1 = center[1] - dy;
		btScalar y2 = center[1] + dy;

		btScalar z1 = center[2] - dz;
		btScalar z2 = center[2] + dz;

		addPoint(vcount,vertices,x1,y1,z1);
		addPoint(vcount,vertices,x2,y1,z1);
		addPoint(vcount,vertices,x2,y2,z1);
		addPoint(vcount,vertices,x1,y2,z1);
		addPoint(vcount,vertices,x1,y1,z2);
		addPoint(vcount,vertices,x2,y1,z2);
		addPoint(vcount,vertices,x2,y2,z2);
		addPoint(vcount,vertices,x1,y2,z2);

		return true; // return cube


	}
	else
	{
		if ( scale )
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0]*=recip[0];
			center[1]*=recip[1];
			center[2]*=recip[2];

		}

	}



	vtx = (const char *) svertices;

	for (unsigned int i=0; i<svcount; i++)
	{
		const btVector3 *p = (const btVector3 *)vtx;
		vtx+=stride;

		btScalar px = p->getX();
		btScalar py = p->getY();
		btScalar pz = p->getZ();

		if ( scale )
		{
			px = px*recip[0]; // normalize
			py = py*recip[1]; // normalize
			pz = pz*recip[2]; // normalize
		}

//		if ( 1 )
		{
			unsigned int j;

			for (j=0; j<vcount; j++)
			{
				/// XXX might be broken
				btVector3& v = vertices[j];

				btScalar x = v[0];
				btScalar y = v[1];
				btScalar z = v[2];

				btScalar dx = btFabs(x - px );
				btScalar dy = btFabs(y - py );
				btScalar dz = btFabs(z - pz );

				if ( dx < normalepsilon && dy < normalepsilon && dz < normalepsilon )
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					btScalar dist1 = GetDist(px,py,pz,center);
					btScalar dist2 = GetDist(v[0],v[1],v[2],center);

					if ( dist1 > dist2 )
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
						
					}

					break;
				}
			}

			if ( j == vcount )
			{
				btVector3& dest = vertices[vcount];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
			m_vertexIndexMapping.push_back(j);
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
//	if ( 1 )
	{
		btScalar bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
		btScalar bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

		for (unsigned int i=0; i<vcount; i++)
		{
			const btVector3& p = vertices[i];
			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}

		btScalar dx = bmax[0] - bmin[0];
		btScalar dy = bmax[1] - bmin[1];
		btScalar dz = bmax[2] - bmin[2];

		if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			btScalar cx = dx*btScalar(0.5) + bmin[0];
			btScalar cy = dy*btScalar(0.5) + bmin[1];
			btScalar cz = dz*btScalar(0.5) + bmin[2];

			btScalar len = FLT_MAX;

			if ( dx >= EPSILON && dx < len ) len = dx;
			if ( dy >= EPSILON && dy < len ) len = dy;
			if ( dz >= EPSILON && dz < len ) len = dz;

			if ( len == FLT_MAX )
			{
				dx = dy = dz = btScalar(0.01); // one centimeter
			}
			else
			{
				if ( dx < EPSILON ) dx = len * btScalar(0.05); // 1/5th the shortest non-zero edge.
				if ( dy < EPSILON ) dy = len * btScalar(0.05);
				if ( dz < EPSILON ) dz = len * btScalar(0.05);
			}

			btScalar x1 = cx - dx;
			btScalar x2 = cx + dx;

			btScalar y1 = cy - dy;
			btScalar y2 = cy + dy;

			btScalar z1 = cz - dz;
			btScalar z2 = cz + dz;

			vcount = 0; // add box

			addPoint(vcount,vertices,x1,y1,z1);
			addPoint(vcount,vertices,x2,y1,z1);
			addPoint(vcount,vertices,x2,y2,z1);
			addPoint(vcount,vertices,x1,y2,z1);
			addPoint(vcount,vertices,x1,y1,z2);
			addPoint(vcount,vertices,x2,y1,z2);
			addPoint(vcount,vertices,x2,y2,z2);
			addPoint(vcount,vertices,x1,y2,z2);

			return true;
		}
	}

	return true;
}